

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

bool __thiscall dtc::fdt::checking::checker::visit_node(checker *this,device_tree *tree,node_ptr *n)

{
  element_type *peVar1;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  bool bVar4;
  int iVar5;
  pointer n_00;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  peVar1 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_70,&peVar1->name,&peVar1->unit_address);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->path,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_70);
  iVar5 = (*this->_vptr_checker[2])(this,tree,n);
  if ((char)iVar5 != '\0') {
    peVar1 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = &((peVar1->props).
               super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
    p_Var2 = &((peVar1->props).
               super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
    do {
      if (p_Var6 == p_Var2) {
        peVar1 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        n_00 = (peVar1->children).
               super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (peVar1->children).
                 super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (n_00 == psVar3) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::pop_back(&(this->path).
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      );
            return true;
          }
          bVar4 = visit_node(this,tree,n_00);
          n_00 = n_00 + 1;
        } while (bVar4);
        return false;
      }
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,p_Var6);
      iVar5 = (*this->_vptr_checker[3])(this,tree,n,&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      p_Var6 = p_Var6 + 1;
    } while ((char)iVar5 != '\0');
  }
  return false;
}

Assistant:

bool
checker::visit_node(device_tree *tree, const node_ptr &n)
{
	path.push_back(std::make_pair(n->name, n->unit_address));
	// Check this node
	if (!check_node(tree, n))
	{
		return false;
	}
	// Now check its properties
	for (auto i=n->property_begin(), e=n->property_end() ; i!=e ; ++i)
	{
		if (!check_property(tree, n, *i))
		{
			return false;
		}
	}
	// And then recursively check the children
	for (node::child_iterator i=n->child_begin(), e=n->child_end() ; i!=e ;
	     ++i)
	{
		if (!visit_node(tree, *i))
		{
			return false;
		}
	}
	path.pop_back();
	return true;
}